

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O0

StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *
google::protobuf::json_internal::UnparseProto2Descriptor::GetString
          (StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          Field f,string *scratch,Msg *msg)

{
  Reflection *this;
  string *u;
  Msg *msg_local;
  string *scratch_local;
  Field f_local;
  
  this = Message::GetReflection(msg);
  u = Reflection::GetStringReference(this,msg,f,scratch);
  absl::lts_20240722::StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_>::
  StatusOr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
            (__return_storage_ptr__,u);
  return __return_storage_ptr__;
}

Assistant:

static absl::StatusOr<absl::string_view> GetString(Field f,
                                                     std::string& scratch,
                                                     const Msg& msg) {
    return msg.GetReflection()->GetStringReference(msg, f, &scratch);
  }